

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.cc
# Opt level: O0

void GEN_CS::gen_cs_test_example(multi_ex *examples,label *cs_labels)

{
  v_array<COST_SENSITIVE::wclass> *this;
  v_array<COST_SENSITIVE::wclass> *pvVar1;
  vector<example_*,_std::allocator<example_*>_> *in_RDI;
  wclass wc;
  uint32_t i;
  wclass *in_stack_ffffffffffffffc8;
  v_array<COST_SENSITIVE::wclass> *in_stack_ffffffffffffffd0;
  undefined4 local_14;
  
  v_array<COST_SENSITIVE::wclass>::clear(in_stack_ffffffffffffffd0);
  local_14 = 0;
  while( true ) {
    this = (v_array<COST_SENSITIVE::wclass> *)(ulong)local_14;
    pvVar1 = (v_array<COST_SENSITIVE::wclass> *)
             std::vector<example_*,_std::allocator<example_*>_>::size(in_RDI);
    if (pvVar1 <= this) break;
    v_array<COST_SENSITIVE::wclass>::push_back(this,in_stack_ffffffffffffffc8);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void gen_cs_test_example(multi_ex& examples, COST_SENSITIVE::label& cs_labels)
{
  cs_labels.costs.clear();
  for (uint32_t i = 0; i < examples.size(); i++)
  {
    COST_SENSITIVE::wclass wc = {FLT_MAX, i, 0., 0.};
    cs_labels.costs.push_back(wc);
  }
}